

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorPushButton.cpp
# Opt level: O1

void __thiscall QColorPushButtonPrivate::~QColorPushButtonPrivate(QColorPushButtonPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x20);
  return;
}

Assistant:

class QColorPushButtonPrivate : public QObject {
    Q_OBJECT

public:
    explicit QColorPushButtonPrivate(QColorPushButton *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , action(new QColorAction(this)) {
        Q_ASSERT(widget);

        action->setProperty("button", QVariant::fromValue(widget));
        syncButtonWithAction();

        connect(widget, &QAbstractButton::clicked, action, &QAction::trigger);
        connect(action, &QColorAction::colorChanged, this, &QColorPushButtonPrivate::syncButtonWithAction);
        connect(action, &QColorAction::colorChanged, widget, &QColorPushButton::colorChanged);
    }

    void syncButtonWithAction() {
        widget->setIcon(action->icon());
        widget->setText(action->text());
        widget->setToolTip(action->toolTip());
    }